

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::PlatformIsAppleIos(cmMakefile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *pcVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  char *__s;
  ulong uVar7;
  undefined1 *puVar8;
  long *plVar9;
  bool bVar10;
  string sdkRoot;
  string embedded [6];
  string local_158;
  long *local_138 [2];
  long local_128 [2];
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  string local_f8;
  undefined1 *local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CMAKE_OSX_SYSROOT","");
  pcVar3 = GetDefinition(this,&local_f8);
  sVar2 = local_158._M_string_length;
  __s = "";
  if (pcVar3 != (char *)0x0) {
    __s = pcVar3;
  }
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)sVar2,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::LowerCase(&local_f8,&local_158);
  std::__cxx11::string::operator=((string *)&local_158,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"appletvos","");
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"appletvsimulator","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"iphoneos","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"iphonesimulator","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"watchos","");
  plVar9 = local_48;
  local_58[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"watchsimulator","");
  lVar4 = std::__cxx11::string::find((char *)&local_158,(ulong)local_f8._M_dataplus._M_p,0);
  if (lVar4 == 0) {
    bVar10 = true;
  }
  else {
    bVar10 = true;
    puVar8 = local_d0;
    uVar7 = 0;
    do {
      local_138[0] = local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/","");
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_138,*(ulong *)(puVar8 + -0x28))
      ;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_108 = *plVar6;
        lStack_100 = plVar5[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *plVar6;
        local_118 = (long *)*plVar5;
      }
      local_110 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      lVar4 = std::__cxx11::string::find((char *)&local_158,(ulong)local_118,0);
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0],local_128[0] + 1);
      }
      if ((lVar4 != -1) || (bVar10 = uVar7 < 5, uVar7 == 5)) break;
      lVar4 = std::__cxx11::string::find((char *)&local_158,*(ulong *)(puVar8 + -8),0);
      puVar8 = puVar8 + 0x20;
      uVar7 = uVar7 + 1;
    } while (lVar4 != 0);
  }
  lVar4 = -0xc0;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  return bVar10;
}

Assistant:

bool cmMakefile::PlatformIsAppleIos() const
{
  std::string sdkRoot;
  sdkRoot = this->GetSafeDefinition("CMAKE_OSX_SYSROOT");
  sdkRoot = cmSystemTools::LowerCase(sdkRoot);

  const std::string embedded[] = {
    "appletvos",       "appletvsimulator", "iphoneos",
    "iphonesimulator", "watchos",          "watchsimulator",
  };

  for (size_t i = 0; i < sizeof(embedded) / sizeof(embedded[0]); ++i) {
    if (sdkRoot.find(embedded[i]) == 0 ||
        sdkRoot.find(std::string("/") + embedded[i]) != std::string::npos) {
      return true;
    }
  }

  return false;
}